

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

RecyclableObject * Js::JavascriptProxy::AutoProxyWrapper(Var obj)

{
  ScriptContext *scriptContext;
  GlobalObject *instance;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  PropertyId propertyId;
  JavascriptProxy *instance_00;
  undefined4 *puVar4;
  Var varArgs [3];
  DynamicObject *local_30;
  Var handler;
  
  instance_00 = (JavascriptProxy *)VarTo<Js::RecyclableObject>(obj);
  BVar3 = JavascriptOperators::IsObject((RecyclableObject *)instance_00);
  if (BVar3 != 0) {
    bVar2 = VarIsImpl<Js::JavascriptProxy>((RecyclableObject *)instance_00);
    if (((!bVar2) &&
        (scriptContext =
              (((((instance_00->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
        scriptContext->threadContext->isScriptActive == true)) &&
       (((scriptContext->config).threadConfig)->m_ES6Proxy == true)) {
      bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x810,
                                    "(Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))"
                                    ,"Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag)")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      propertyId = EnsureHandlerPropertyId(scriptContext);
      instance = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).globalObject.ptr;
      local_30 = (DynamicObject *)0x0;
      BVar3 = JavascriptOperators::GetProperty
                        ((RecyclableObject *)instance,propertyId,&local_30,scriptContext,
                         (PropertyValueInfo *)0x0);
      if (BVar3 == 0) {
        local_30 = JavascriptLibrary::CreateObject
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
        JavascriptOperators::SetProperty
                  (instance,(RecyclableObject *)instance,propertyId,local_30,scriptContext,
                   PropertyOperation_None);
      }
      varArgs[1] = local_30;
      varArgs[2] = (Var)0x2000003;
      varArgs[0] = instance_00;
      instance_00 = Create(scriptContext,(Arguments *)(varArgs + 2));
    }
  }
  return (RecyclableObject *)instance_00;
}

Assistant:

RecyclableObject* JavascriptProxy::AutoProxyWrapper(Var obj)
    {
        RecyclableObject* object = VarTo<RecyclableObject>(obj);
        if (!JavascriptOperators::IsObject(object) || VarIs<JavascriptProxy>(object))
        {
            return object;
        }
        ScriptContext* scriptContext = object->GetScriptContext();
        if (!scriptContext->GetThreadContext()->IsScriptActive())
        {
            return object;
        }
        if (!scriptContext->GetConfig()->IsES6ProxyEnabled())
        {
            return object;
        }
        Assert(Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag));
        PropertyId handlerId = EnsureHandlerPropertyId(scriptContext);
        GlobalObject* globalObject = scriptContext->GetLibrary()->GetGlobalObject();
        Var handler = nullptr;
        if (!JavascriptOperators::GetProperty(globalObject, handlerId, &handler, scriptContext))
        {
            handler = scriptContext->GetLibrary()->CreateObject();
            JavascriptOperators::SetProperty(globalObject, globalObject, handlerId, handler, scriptContext);
        }
        CallInfo callInfo(CallFlags_Value, 3);
        Var varArgs[3];
        Js::Arguments arguments(callInfo, varArgs);
        varArgs[0] = scriptContext->GetLibrary()->GetProxyConstructor();
        varArgs[1] = object;
        varArgs[2] = handler;
        return Create(scriptContext, arguments);
    }